

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_typed_array(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 span<const_unsigned_int,_18446744073709551615UL> *data,semantic_tag tag,
                 ser_context *context,error_code *ec)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  byte_string_view local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  if ((this->options_).use_typed_arrays_ == true) {
    binary_stream_sink::push_back(&this->sink_,0xd8);
    binary_stream_sink::push_back(&this->sink_,'F');
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_38,data->size_ << 2,(allocator_type *)&local_48);
    memcpy(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,data->data_,data->size_ << 2);
    local_48.data_ =
         local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.size_ =
         (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    write_byte_string(this,&local_48);
    basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::visit_typed_array();
  }
  else {
    basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::visit_typed_array();
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint32_t>& data,  
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            write_typed_array_tag(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>(), 
                                  uint32_t(), 
                                  tag);
            std::vector<uint8_t> v(data.size()*sizeof(uint32_t));
            std::memcpy(v.data(), data.data(), data.size()*sizeof(uint32_t));
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(data.size(), semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = data.begin(); p != data.end(); ++p)
            {
                this->uint64_value(*p, semantic_tag::none, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }